

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O3

future<dap::ResponseOrError<dap::LaunchResponse>_> __thiscall
dap::Session::send<dap::LaunchRequest,void>(Session *this,LaunchRequest *request)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  char cVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TypeInfo *pTVar4;
  TypeInfo *pTVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  future<dap::ResponseOrError<dap::LaunchResponse>_> fVar6;
  Error local_98;
  undefined8 *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  code *local_68;
  code *local_60 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  element_type *local_48;
  unique_lock<std::mutex> local_40;
  
  local_48 = (element_type *)this;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x98);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00bb8490;
  __s = this_00 + 1;
  memset(__s,0,0x88);
  *(_Atomic_word **)&this_00[1]._M_use_count = &this_00[2]._M_use_count;
  this_00[3]._M_use_count = 0;
  this_00[3]._M_weak_count = 0;
  this_00[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[4]._M_use_count = 0;
  this_00[4]._M_weak_count = 0;
  this_00[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00[5]._M_use_count = 0;
  this_00[5]._M_weak_count = 0;
  local_50 = this_00 + 6;
  std::condition_variable::condition_variable((condition_variable *)local_50);
  *(undefined1 *)&this_00[9]._vptr__Sp_counted_base = 0;
  pTVar4 = TypeOf<dap::LaunchRequest>::type();
  pTVar5 = TypeOf<dap::LaunchResponse>::type();
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  local_78 = (undefined8 *)operator_new(0x10);
  *local_78 = __s;
  local_78[1] = this_00;
  local_60[0] = std::
                _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
                ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_void_*,_const_dap::Error_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/session.h:422:20)>
             ::_M_manager;
  cVar3 = (**(code **)((long)(request->restart).val.value.value + 0x50))(request,pTVar4,pTVar5);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  if (cVar3 == '\0') {
    Error::Error(&local_98,"Failed to send request");
    local_40._M_device = (mutex_type *)&this_00[3]._M_use_count;
    paVar1 = &local_98.message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.message._M_dataplus._M_p == paVar1) {
      local_60[1] = (code *)local_98.message.field_2._8_8_;
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_60;
    }
    else {
      local_70 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_98.message._M_dataplus._M_p;
    }
    local_60[0] = (code *)CONCAT71(local_98.message.field_2._M_allocated_capacity._1_7_,
                                   local_98.message.field_2._M_local_buf[0]);
    local_68 = (code *)local_98.message._M_string_length;
    local_98.message._M_string_length = 0;
    local_98.message.field_2._M_local_buf[0] = '\0';
    local_40._M_owns = false;
    local_98.message._M_dataplus._M_p = (pointer)paVar1;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    std::__cxx11::string::operator=((string *)&this_00[1]._M_use_count,(string *)&local_70);
    *(undefined1 *)&this_00[9]._vptr__Sp_counted_base = 1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    if (local_70 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60) {
      operator_delete(local_70,(ulong)((long)local_60[0] + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.message._M_dataplus._M_p != &local_98.message.field_2) {
      operator_delete(local_98.message._M_dataplus._M_p,
                      CONCAT71(local_98.message.field_2._M_allocated_capacity._1_7_,
                               local_98.message.field_2._M_local_buf[0]) + 1);
    }
  }
  peVar2 = local_48;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_48->val = __s;
  (local_48->val).error.message._M_dataplus._M_p = (pointer)this_00;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  fVar6.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  fVar6.state.
  super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  return (future<dap::ResponseOrError<dap::LaunchResponse>_>)
         fVar6.state.
         super___shared_ptr<dap::detail::promise_state<dap::ResponseOrError<dap::LaunchResponse>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

future<ResponseOrError<typename T::Response>> Session::send(const T& request) {
  using Response = typename T::Response;
  promise<ResponseOrError<Response>> promise;
  auto sent = send(TypeOf<T>::type(), TypeOf<Response>::type(), &request,
                   [=](const void* result, const Error* error) {
                     if (error != nullptr) {
                       promise.set_value(ResponseOrError<Response>(*error));
                     } else {
                       promise.set_value(ResponseOrError<Response>(
                           *reinterpret_cast<const Response*>(result)));
                     }
                   });
  if (!sent) {
    promise.set_value(Error("Failed to send request"));
  }
  return promise.get_future();
}